

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor_tests.cpp
# Opt level: O2

void check_bson_cursor_document<jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>>>
               (string *info,
               basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *cursor,
               string *expectedKey,int expectedValue)

{
  Flags FVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  staj_event_type local_251;
  string *local_250;
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  AssertionHandler catchAssertionHandler;
  int expectedValue_local;
  StringRef local_190;
  StringRef local_180;
  StringRef local_170;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  ScopedMessage scopedMessage7;
  
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6579d8;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xac;
  expectedValue_local = expectedValue;
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)&catchAssertionHandler,(StringRef *)&local_248,
             (SourceLineInfo *)&local_218,Info);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.lineInfo.file,(string *)info);
  Catch::ScopedMessage::ScopedMessage(&scopedMessage7,(MessageBuilder *)&catchAssertionHandler);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x657758;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xae;
  Catch::StringRef::StringRef(&local_150,"cursor.done()");
  FVar1 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_150,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_248.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_248);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xaf;
  Catch::StringRef::StringRef
            (&local_90,"staj_event_type::begin_object == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_90,
             ContinueOnFailure);
  local_218._M_dataplus._M_p = (pointer)&local_250;
  local_250._0_1_ = (ExprLhs<std::__cxx11::string_const&>)0xd;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_251 = *(staj_event_type *)CONCAT44(extraout_var,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_248,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_218,&local_251);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xb0;
  Catch::StringRef::StringRef(&local_a0,"semantic_tag::none == cursor.current().tag()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_a0,
             ContinueOnFailure);
  local_250._0_1_ = (ExprLhs<std::__cxx11::string_const&>)0x0;
  local_218._M_dataplus._M_p = (pointer)&local_250;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_251 = *(staj_event_type *)(CONCAT44(extraout_var_00,iVar2) + 1);
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)
             &local_248,(ExprLhs<jsoncons::semantic_tag_const&> *)&local_218,&local_251);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x657758;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xb2;
  Catch::StringRef::StringRef(&local_160,"cursor.done()");
  FVar1 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_160,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_248.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_248);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xb4;
  Catch::StringRef::StringRef(&local_b0,"staj_event_type::key == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_b0,
             ContinueOnFailure);
  local_250._0_1_ = (ExprLhs<std::__cxx11::string_const&>)0x0;
  local_218._M_dataplus._M_p = (pointer)&local_250;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_251 = *(staj_event_type *)CONCAT44(extraout_var_01,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_248,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_218,&local_251);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xb5;
  Catch::StringRef::StringRef(&local_c0,"semantic_tag::none == cursor.current().tag()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_c0,
             ContinueOnFailure);
  local_250 = (string *)((ulong)local_250._1_7_ << 8);
  local_218._M_dataplus._M_p = (pointer)&local_250;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_251 = *(staj_event_type *)(CONCAT44(extraout_var_02,iVar2) + 1);
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)
             &local_248,(ExprLhs<jsoncons::semantic_tag_const&> *)&local_218,&local_251);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xb6;
  Catch::StringRef::StringRef
            (&local_d0,"expectedKey == cursor.current().template get<std::string>()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_d0,
             ContinueOnFailure);
  local_250 = expectedKey;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  jsoncons::basic_staj_event<char>::get<std::__cxx11::string>
            (&local_218,(basic_staj_event<char> *)CONCAT44(extraout_var_03,iVar2));
  Catch::ExprLhs<std::__cxx11::string_const&>::operator==
            (&local_248,(ExprLhs<std::__cxx11::string_const&> *)&local_250,&local_218);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  std::__cxx11::string::~string((string *)&local_218);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_string_length = 0xb7;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  Catch::StringRef::StringRef
            (&local_e0,"expectedKey == cursor.current().template get<jsoncons::string_view>()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_e0,
             ContinueOnFailure);
  local_250 = expectedKey;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_218._0_16_ =
       jsoncons::basic_staj_event<char>::get<std::basic_string_view<char,std::char_traits<char>>>
                 ((basic_staj_event<char> *)CONCAT44(extraout_var_04,iVar2));
  Catch::ExprLhs<std::__cxx11::string_const&>::operator==
            ((BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
              *)&local_248,(ExprLhs<std::__cxx11::string_const&> *)&local_250,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_218);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x657758;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xb9;
  Catch::StringRef::StringRef(&local_170,"cursor.done()");
  FVar1 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_170,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_248.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_248);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xbb;
  Catch::StringRef::StringRef
            (&local_f0,"staj_event_type::int64_value == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_f0,
             ContinueOnFailure);
  local_250._0_1_ = (ExprLhs<std::__cxx11::string_const&>)0x5;
  local_218._M_dataplus._M_p = (pointer)&local_250;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_251 = *(staj_event_type *)CONCAT44(extraout_var_05,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_248,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_218,&local_251);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xbc;
  Catch::StringRef::StringRef(&local_100,"semantic_tag::none == cursor.current().tag()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_100,
             ContinueOnFailure);
  local_250 = (string *)((ulong)local_250._1_7_ << 8);
  local_218._M_dataplus._M_p = (pointer)&local_250;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_251 = *(staj_event_type *)(CONCAT44(extraout_var_06,iVar2) + 1);
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)
             &local_248,(ExprLhs<jsoncons::semantic_tag_const&> *)&local_218,&local_251);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xbd;
  Catch::StringRef::StringRef(&local_110,"expectedValue == cursor.current().template get<int>()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_110,
             ContinueOnFailure);
  local_218._M_dataplus._M_p = (pointer)&expectedValue_local;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  iVar2 = jsoncons::basic_staj_event<char>::get<int>
                    ((basic_staj_event<char> *)CONCAT44(extraout_var_07,iVar2));
  local_250 = (string *)CONCAT44(local_250._4_4_,iVar2);
  Catch::ExprLhs<int_const&>::operator==
            ((BinaryExpr<const_int_&,_const_int_&> *)&local_248,(ExprLhs<int_const&> *)&local_218,
             (int *)&local_250);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x657758;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xbf;
  Catch::StringRef::StringRef(&local_180,"cursor.done()");
  FVar1 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_180,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_248.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_248);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xc1;
  Catch::StringRef::StringRef
            (&local_120,"staj_event_type::end_object == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_120,
             ContinueOnFailure);
  local_250._0_1_ = (ExprLhs<std::__cxx11::string_const&>)0x7;
  local_218._M_dataplus._M_p = (pointer)&local_250;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_251 = *(staj_event_type *)CONCAT44(extraout_var_08,iVar2);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
             &local_248,(ExprLhs<jsoncons::staj_event_type_const&> *)&local_218,&local_251);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xc2;
  Catch::StringRef::StringRef(&local_130,"semantic_tag::none == cursor.current().tag()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_130,
             ContinueOnFailure);
  local_250 = (string *)((ulong)local_250._1_7_ << 8);
  local_218._M_dataplus._M_p = (pointer)&local_250;
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  local_251 = *(staj_event_type *)(CONCAT44(extraout_var_09,iVar2) + 1);
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)
             &local_248,(ExprLhs<jsoncons::semantic_tag_const&> *)&local_218,&local_251);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_248.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_248.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65778c;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_218._M_string_length = 0xc5;
  Catch::StringRef::StringRef(&local_190,"cursor.done()");
  FVar1 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_190,
             FVar1);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_248.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_248);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_248.super_ITransientExpression.m_isBinaryExpression = true;
  local_248.super_ITransientExpression.m_result = false;
  local_248.super_ITransientExpression._10_6_ = 0;
  local_218._M_string_length = 199;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  Catch::StringRef::StringRef(&local_140,"cursor.done()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_248,(SourceLineInfo *)&local_218,local_140,
             ContinueOnFailure);
  iVar2 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_248.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_248.super_ITransientExpression._vptr_ITransientExpression._1_7_,(char)iVar2);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_248);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage7);
  return;
}

Assistant:

void check_bson_cursor_document(std::string info, CursorType& cursor,
                                std::string expectedKey, int expectedValue)
{
    INFO(info);

    REQUIRE_FALSE(cursor.done());
    CHECK(staj_event_type::begin_object == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());

    REQUIRE_FALSE(cursor.done());
    cursor.next();
    CHECK(staj_event_type::key == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());
    CHECK(expectedKey == cursor.current().template get<std::string>());
    CHECK(expectedKey == cursor.current().template get<jsoncons::string_view>());

    REQUIRE_FALSE(cursor.done());
    cursor.next();
    CHECK(staj_event_type::int64_value == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());
    CHECK(expectedValue == cursor.current().template get<int>());

    REQUIRE_FALSE(cursor.done());
    cursor.next();
    CHECK(staj_event_type::end_object == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());

    // Extra next() required to pop out of document state
    CHECK_FALSE(cursor.done());
    cursor.next();
    CHECK(cursor.done());
}